

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void opj_calculate_norms(OPJ_FLOAT64 *pNorms,OPJ_UINT32 pNbComps,OPJ_FLOAT32 *pMatrix)

{
  ulong uVar1;
  double dVar2;
  OPJ_FLOAT32 *lMatrix;
  OPJ_FLOAT64 *lNorms;
  OPJ_FLOAT32 lCurrentValue;
  OPJ_UINT32 lIndex;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *pMatrix_local;
  OPJ_UINT32 pNbComps_local;
  OPJ_FLOAT64 *pNorms_local;
  
  for (lIndex = 0; lIndex < pNbComps; lIndex = lIndex + 1) {
    pNorms[lIndex] = 0.0;
    lNorms._4_4_ = lIndex;
    for (lCurrentValue = 0.0; (uint)lCurrentValue < pNbComps;
        lCurrentValue = (OPJ_FLOAT32)((int)lCurrentValue + 1)) {
      uVar1 = (ulong)lNorms._4_4_;
      lNorms._4_4_ = pNbComps + lNorms._4_4_;
      pNorms[lIndex] =
           (OPJ_FLOAT64)
           ((double)((float)pMatrix[uVar1] * (float)pMatrix[uVar1]) + (double)pNorms[lIndex]);
    }
    dVar2 = sqrt((double)pNorms[lIndex]);
    pNorms[lIndex] = (OPJ_FLOAT64)dVar2;
  }
  return;
}

Assistant:

void opj_calculate_norms(OPJ_FLOAT64 * pNorms,
                         OPJ_UINT32 pNbComps,
                         OPJ_FLOAT32 * pMatrix)
{
    OPJ_UINT32 i, j, lIndex;
    OPJ_FLOAT32 lCurrentValue;
    OPJ_FLOAT64 * lNorms = (OPJ_FLOAT64 *) pNorms;
    OPJ_FLOAT32 * lMatrix = (OPJ_FLOAT32 *) pMatrix;

    for (i = 0; i < pNbComps; ++i) {
        lNorms[i] = 0;
        lIndex = i;

        for (j = 0; j < pNbComps; ++j) {
            lCurrentValue = lMatrix[lIndex];
            lIndex += pNbComps;
            lNorms[i] += lCurrentValue * lCurrentValue;
        }
        lNorms[i] = sqrt(lNorms[i]);
    }
}